

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  nk_cursor *img;
  void *pvVar4;
  nk_size nVar5;
  long lVar6;
  nk_window *pnVar7;
  nk_window *pnVar8;
  nk_window *pnVar9;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3ba7,"const struct nk_command *nk__begin(struct nk_context *)");
  }
  if (ctx->count != 0) {
    pvVar3 = (ctx->memory).memory.ptr;
    if (ctx->build == 0) {
      if ((ctx->style).cursor_active == (nk_cursor *)0x0) {
        (ctx->style).cursor_active = (ctx->style).cursors[0];
      }
      img = (ctx->style).cursor_active;
      if (((img != (nk_cursor *)0x0) && ((ctx->input).mouse.grabbed == '\0')) &&
         ((ctx->style).cursor_visible != 0)) {
        (ctx->overlay).base = &ctx->memory;
        (ctx->overlay).use_clipping = 0;
        nVar5 = (ctx->memory).allocated;
        (ctx->overlay).begin = nVar5;
        (ctx->overlay).end = nVar5;
        (ctx->overlay).last = nVar5;
        (ctx->overlay).clip = nk_null_rect;
        r.x = (ctx->input).mouse.pos.x - (img->offset).x;
        uVar1 = (img->size).x;
        uVar2 = (img->size).y;
        r.h = (float)uVar2;
        r.w = (float)uVar1;
        r.y = (ctx->input).mouse.pos.y - (img->offset).y;
        nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
        (ctx->overlay).end = (ctx->memory).allocated;
      }
      pnVar7 = ctx->begin;
      pvVar4 = (ctx->memory).memory.ptr;
      if (pnVar7 == (nk_window *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        pnVar9 = pnVar7;
        do {
          nVar5 = (pnVar9->buffer).last;
          pnVar8 = pnVar9->next;
          if (((nVar5 != (pnVar9->buffer).begin) && ((pnVar9->flags & 0x2000) == 0)) &&
             (pnVar9->seq == ctx->seq)) {
            lVar6 = nVar5 + (long)pvVar4;
            for (; pnVar8 != (nk_window *)0x0; pnVar8 = pnVar8->next) {
              nVar5 = (pnVar8->buffer).begin;
              if ((((pnVar8->buffer).last != nVar5) && ((pnVar8->flags & 0x2000) == 0)) &&
                 (pnVar8->seq == ctx->seq)) {
                *(nk_size *)(lVar6 + 8) = nVar5;
                goto LAB_0010dbeb;
              }
            }
            pnVar8 = (nk_window *)0x0;
          }
LAB_0010dbeb:
          pnVar9 = pnVar8;
        } while (pnVar8 != (nk_window *)0x0);
      }
      while (pnVar9 = pnVar7, pnVar9 != (nk_window *)0x0) {
        pnVar7 = pnVar9->next;
        if ((pnVar9->popup).buf.active != 0) {
          *(nk_size *)(lVar6 + 8) = (pnVar9->popup).buf.begin;
          lVar6 = (pnVar9->popup).buf.last + (long)pvVar4;
          (pnVar9->popup).buf.active = 0;
        }
      }
      if (lVar6 != 0) {
        nVar5 = (ctx->overlay).begin;
        if ((ctx->overlay).end == nVar5) {
          nVar5 = (ctx->memory).allocated;
        }
        *(nk_size *)(lVar6 + 8) = nVar5;
      }
      ctx->build = 1;
    }
    pnVar7 = ctx->begin;
    if (pnVar7 != (nk_window *)0x0) {
      while (((nVar5 = (pnVar7->buffer).begin, nVar5 == (pnVar7->buffer).end ||
              ((pnVar7->flags & 0x2000) != 0)) || (pnVar7->seq != ctx->seq))) {
        pnVar7 = pnVar7->next;
        if (pnVar7 == (nk_window *)0x0) {
          return (nk_command *)0x0;
        }
      }
      return (nk_command *)((long)pvVar3 + nVar5);
    }
  }
  return (nk_command *)0x0;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }
    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) ||
        (iter->flags & NK_WINDOW_HIDDEN) || iter->seq != ctx->seq))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}